

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindGenericRoundFunctionDecimal<duckdb::RoundDecimalOperator>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalType *type;
  PhysicalType PVar1;
  uint8_t uVar2;
  uint8_t width;
  reference this_00;
  pointer pEVar3;
  reference this_01;
  code *__f;
  LogicalType LStack_48;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(arguments,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  type = &pEVar3->return_type;
  uVar2 = DecimalType::GetScale(type);
  width = DecimalType::GetWidth(type);
  if (uVar2 == '\0') {
    __f = ScalarFunction::NopFunction;
  }
  else {
    PVar1 = (pEVar3->return_type).physical_type_;
    if (PVar1 == INT64) {
      __f = GenericRoundFunctionDecimal<long,duckdb::NumericHelper,duckdb::RoundDecimalOperator>;
    }
    else if (PVar1 == INT32) {
      __f = GenericRoundFunctionDecimal<int,duckdb::NumericHelper,duckdb::RoundDecimalOperator>;
    }
    else if (PVar1 == INT16) {
      __f = GenericRoundFunctionDecimal<short,duckdb::NumericHelper,duckdb::RoundDecimalOperator>;
    }
    else {
      __f = 
      GenericRoundFunctionDecimal<duckdb::hugeint_t,duckdb::Hugeint,duckdb::RoundDecimalOperator>;
    }
  }
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
            ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
             &bound_function->function,__f);
  this_01 = vector<duckdb::LogicalType,_true>::get<true>
                      (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0)
  ;
  LogicalType::operator=(this_01,type);
  LogicalType::DECIMAL(&LStack_48,width,'\0');
  LogicalType::operator=(&(bound_function->super_BaseScalarFunction).return_type,&LStack_48);
  LogicalType::~LogicalType(&LStack_48);
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindGenericRoundFunctionDecimal(ClientContext &context, ScalarFunction &bound_function,
                                                         vector<unique_ptr<Expression>> &arguments) {
	// ceil essentially removes the scale
	auto &decimal_type = arguments[0]->return_type;
	auto scale = DecimalType::GetScale(decimal_type);
	auto width = DecimalType::GetWidth(decimal_type);
	if (scale == 0) {
		bound_function.function = ScalarFunction::NopFunction;
	} else {
		switch (decimal_type.InternalType()) {
		case PhysicalType::INT16:
			bound_function.function = GenericRoundFunctionDecimal<int16_t, NumericHelper, OP>;
			break;
		case PhysicalType::INT32:
			bound_function.function = GenericRoundFunctionDecimal<int32_t, NumericHelper, OP>;
			break;
		case PhysicalType::INT64:
			bound_function.function = GenericRoundFunctionDecimal<int64_t, NumericHelper, OP>;
			break;
		default:
			bound_function.function = GenericRoundFunctionDecimal<hugeint_t, Hugeint, OP>;
			break;
		}
	}
	bound_function.arguments[0] = decimal_type;
	bound_function.return_type = LogicalType::DECIMAL(width, 0);
	return nullptr;
}